

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_xor_lazy_inplace(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *x1;
  roaring_bitmap_t *r_00;
  roaring_bitmap_t *r2_00;
  uint64_t uVar4;
  byte in_DIL;
  int i_3;
  _Bool is_equal;
  roaring_bitmap_t *result;
  roaring_bitmap_t *expected;
  int j;
  int i_2;
  roaring_bitmap_t *r [10];
  int i_1;
  int ansctr;
  roaring_bitmap_t *r1_xor_r2;
  uint32_t i;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int iVar5;
  undefined4 in_stack_ffffffffffffff5c;
  roaring_bitmap_t *in_stack_ffffffffffffff60;
  roaring_bitmap_t *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  uint uVar6;
  uint uVar7;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  roaring_bitmap_t *in_stack_ffffffffffffff90;
  roaring_bitmap_t *in_stack_ffffffffffffffa8;
  roaring_bitmap_t *in_stack_ffffffffffffffb0;
  uint local_30;
  uint local_1c;
  
  _Var1 = (_Bool)(in_DIL & 1);
  prVar2 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar2,_Var1);
  prVar2 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar2,_Var1);
  for (local_1c = 0; local_1c < 300; local_1c = local_1c + 1) {
    if ((local_1c & 1) == 0) {
      roaring_bitmap_add(in_stack_ffffffffffffff90,
                         (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
    if (local_1c % 3 == 0) {
      roaring_bitmap_add(in_stack_ffffffffffffff90,
                         (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
  }
  prVar2 = roaring_bitmap_copy(in_stack_ffffffffffffff68);
  roaring_bitmap_set_copy_on_write(prVar2,_Var1);
  roaring_bitmap_lazy_xor_inplace(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  roaring_bitmap_repair_after_lazy
            ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  for (local_30 = 0; (int)local_30 < 300; local_30 = local_30 + 1) {
    if ((((int)local_30 % 2 == 0) || ((int)local_30 % 3 == 0)) && ((int)local_30 % 6 != 0)) {
      _Var1 = roaring_bitmap_contains
                        ((roaring_bitmap_t *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff54);
      if (!_Var1) {
        printf("missing %d\n",(ulong)local_30);
      }
    }
    else {
      _Var1 = roaring_bitmap_contains
                        ((roaring_bitmap_t *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff54);
      if (_Var1) {
        printf("surplus %d\n",(ulong)local_30);
      }
    }
  }
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffff60);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff60,
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                    (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
  roaring_bitmap_free((roaring_bitmap_t *)0x107a9a);
  roaring_bitmap_free((roaring_bitmap_t *)0x107aa7);
  roaring_bitmap_free((roaring_bitmap_t *)0x107ab4);
  prVar2 = gen_bitmap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (int)in_stack_ffffffffffffff68);
  prVar3 = gen_bitmap(in_stack_ffffffffffffff80,(double)prVar2,in_stack_ffffffffffffff74,
                      in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  x2 = gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                  (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  x1 = gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                  (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
  prVar2 = gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff74,
                      in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                      (int)in_stack_ffffffffffffff68);
  prVar3 = (roaring_bitmap_t *)0x0;
  uVar6 = 0;
  while (uVar7 = uVar6, *(long *)(&stack0xffffffffffffff78 + (long)(int)uVar6 * 8) != 0) {
    while (*(long *)(&stack0xffffffffffffff78 + (long)(int)uVar6 * 8) != 0) {
      r_00 = synthesized_xor(prVar3,prVar2);
      r2_00 = roaring_bitmap_copy(r_00);
      roaring_bitmap_lazy_xor_inplace(x1,x2);
      roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)CONCAT44(uVar7,uVar6));
      _Var1 = roaring_bitmap_equals(r_00,r2_00);
      in_stack_ffffffffffffff5c = CONCAT13(_Var1,(int3)in_stack_ffffffffffffff5c);
      if (!_Var1) {
        printf("problem with i=%d j=%d\n",(ulong)uVar7,(ulong)uVar6);
        uVar4 = roaring_bitmap_get_cardinality(r2_00);
        in_stack_ffffffffffffff54 = (uint)uVar4;
        uVar4 = roaring_bitmap_get_cardinality(r2_00);
        printf("result\'s cardinality  is %d and expected\'s is %d\n",
               (ulong)in_stack_ffffffffffffff54,uVar4 & 0xffffffff);
        show_difference((roaring_bitmap_t *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (roaring_bitmap_t *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      _assert_true((unsigned_long)r2_00,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c);
      roaring_bitmap_free((roaring_bitmap_t *)0x107d34);
      roaring_bitmap_free((roaring_bitmap_t *)0x107d3e);
      uVar6 = uVar6 + 1;
    }
    uVar6 = uVar7 + 1;
  }
  iVar5 = 0;
  while (*(long *)(&stack0xffffffffffffff78 + (long)iVar5 * 8) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x107d84);
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void test_xor_lazy_inplace(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_copy(r1);
    roaring_bitmap_set_copy_on_write(r1_xor_r2, copy_on_write);

    roaring_bitmap_lazy_xor_inplace(r1_xor_r2, r2);
    roaring_bitmap_repair_after_lazy(r1_xor_r2);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if (((i % 2 == 0) || (i % 3 == 0)) && (i % 6 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_xor_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_xor_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_xor_r2), ansctr);

    roaring_bitmap_free(r1_xor_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data
    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);

            roaring_bitmap_t *result = roaring_bitmap_copy(r[i]);
            roaring_bitmap_lazy_xor_inplace(result, r[j]);
            roaring_bitmap_repair_after_lazy(result);

            bool is_equal = roaring_bitmap_equals(expected, result);
            if (!is_equal) {
                printf("problem with i=%d j=%d\n", i, j);
                printf("result's cardinality  is %d and expected's is %d\n",
                       (int)roaring_bitmap_get_cardinality(result),
                       (int)roaring_bitmap_get_cardinality(expected));
                show_difference(result, expected);
            }

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}